

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * decNaNs(decNumber *res,decNumber *lhs,decNumber *rhs,decContext *set,uint32_t *status)

{
  uint local_58;
  uint local_54;
  uint8_t *uresp1;
  uint8_t *ur;
  uint8_t *ul;
  uint32_t *status_local;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *lhs_local;
  decNumber *res_local;
  
  rhs_local = lhs;
  if ((lhs->bits & 0x10) == 0) {
    if (rhs != (decNumber *)0x0) {
      rhs_local = rhs;
      if ((rhs->bits & 0x10) == 0) {
        if ((lhs->bits & 0x20) != 0) {
          rhs_local = lhs;
        }
      }
      else {
        *status = *status | 0x40000080;
      }
    }
  }
  else {
    *status = *status | 0x40000080;
  }
  if (set->digits < rhs_local->digits) {
    res->bits = rhs_local->bits;
    if (set->digits < 0x32) {
      local_54 = (uint)""[set->digits];
    }
    else {
      local_54 = set->digits / 1;
    }
    ur = rhs_local->lsu;
    for (uresp1 = res->lsu; uresp1 < res->lsu + (int)local_54; uresp1 = uresp1 + 1) {
      *uresp1 = *ur;
      ur = ur + 1;
    }
    if (set->digits < 0x32) {
      local_58 = (uint)""[set->digits];
    }
    else {
      local_58 = set->digits / 1;
    }
    res->digits = local_58;
    if (set->digits < res->digits) {
      decDecap(res,res->digits - set->digits);
    }
  }
  else {
    uprv_decNumberCopy_63(res,rhs_local);
  }
  res->bits = res->bits & 0xef;
  res->bits = res->bits | 0x20;
  res->exponent = 0;
  return res;
}

Assistant:

static decNumber * decNaNs(decNumber *res, const decNumber *lhs,
                           const decNumber *rhs, decContext *set,
                           uInt *status) {
  /* This decision tree ends up with LHS being the source pointer,  */
  /* and status updated if need be  */
  if (lhs->bits & DECSNAN)
    *status|=DEC_Invalid_operation | DEC_sNaN;
   else if (rhs==NULL);
   else if (rhs->bits & DECSNAN) {
    lhs=rhs;
    *status|=DEC_Invalid_operation | DEC_sNaN;
    }
   else if (lhs->bits & DECNAN);
   else lhs=rhs;

  /* propagate the payload  */
  if (lhs->digits<=set->digits) uprv_decNumberCopy(res, lhs); /* easy  */
   else { /* too long  */
    const Unit *ul;
    Unit *ur, *uresp1;
    /* copy safe number of units, then decapitate  */
    res->bits=lhs->bits;                /* need sign etc.  */
    uresp1=res->lsu+D2U(set->digits);
    for (ur=res->lsu, ul=lhs->lsu; ur<uresp1; ur++, ul++) *ur=*ul;
    res->digits=D2U(set->digits)*DECDPUN;
    /* maybe still too long  */
    if (res->digits>set->digits) decDecap(res, res->digits-set->digits);
    }

  res->bits&=~DECSNAN;        /* convert any sNaN to NaN, while  */
  res->bits|=DECNAN;          /* .. preserving sign  */
  res->exponent=0;            /* clean exponent  */
                              /* [coefficient was copied/decapitated]  */
  return res;
  }